

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.c
# Opt level: O0

void nn_xpub_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_dist_data *data_00;
  nn_sockbase *local_30;
  nn_xpub_data *data;
  nn_xpub *xpub;
  nn_pipe *pipe_local;
  nn_sockbase *self_local;
  
  local_30 = self;
  if (self == (nn_sockbase *)0x0) {
    local_30 = (nn_sockbase *)0x0;
  }
  data_00 = (nn_dist_data *)nn_pipe_getdata(pipe);
  nn_dist_rm((nn_dist *)(local_30 + 1),data_00);
  nn_free(data_00);
  return;
}

Assistant:

static void nn_xpub_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpub *xpub;
    struct nn_xpub_data *data;

    xpub = nn_cont (self, struct nn_xpub, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_dist_rm (&xpub->outpipes, &data->item);

    nn_free (data);
}